

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O1

void __thiscall glcts::TextureBufferParameters::initTest(TextureBufferParameters *this)

{
  InternalFormatsMap *this_00;
  int iVar1;
  deUint32 dVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  key_type_conflict local_34;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported != false) {
    this_00 = &this->m_internal_formats;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 1;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 1;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 1;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 2;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0xc;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0xc;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0xc;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0x10;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0x10;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 4;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 8;
    pmVar3 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_34);
    *pmVar3 = 0x10;
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_to_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not generate texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                    ,99);
    (**(code **)(lVar4 + 0xb8))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_to_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not bind texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                    ,0x66);
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_tbo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not generate buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                    ,0x69);
    (**(code **)(lVar4 + 0x40))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not bind buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                    ,0x6c);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture buffer functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
             ,0x3d);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferParameters::initTest(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	m_internal_formats[GL_R8]		= sizeof(glw::GLubyte) * 1 /* components */;
	m_internal_formats[GL_R16F]		= sizeof(glw::GLhalf) * 1 /* components */;
	m_internal_formats[GL_R32F]		= sizeof(glw::GLfloat) * 1 /* components */;
	m_internal_formats[GL_R8I]		= sizeof(glw::GLbyte) * 1 /* components */;
	m_internal_formats[GL_R16I]		= sizeof(glw::GLshort) * 1 /* components */;
	m_internal_formats[GL_R32I]		= sizeof(glw::GLint) * 1 /* components */;
	m_internal_formats[GL_R8UI]		= sizeof(glw::GLubyte) * 1 /* components */;
	m_internal_formats[GL_R16UI]	= sizeof(glw::GLushort) * 1 /* components */;
	m_internal_formats[GL_R32UI]	= sizeof(glw::GLuint) * 1 /* components */;
	m_internal_formats[GL_RG8]		= sizeof(glw::GLubyte) * 2 /* components */;
	m_internal_formats[GL_RG16F]	= sizeof(glw::GLhalf) * 2 /* components */;
	m_internal_formats[GL_RG32F]	= sizeof(glw::GLfloat) * 2 /* components */;
	m_internal_formats[GL_RG8I]		= sizeof(glw::GLbyte) * 2 /* components */;
	m_internal_formats[GL_RG16I]	= sizeof(glw::GLshort) * 2 /* components */;
	m_internal_formats[GL_RG32I]	= sizeof(glw::GLint) * 2 /* components */;
	m_internal_formats[GL_RG8UI]	= sizeof(glw::GLubyte) * 2 /* components */;
	m_internal_formats[GL_RG16UI]   = sizeof(glw::GLushort) * 2 /* components */;
	m_internal_formats[GL_RG32UI]   = sizeof(glw::GLuint) * 2 /* components */;
	m_internal_formats[GL_RGB32F]   = sizeof(glw::GLfloat) * 3 /* components */;
	m_internal_formats[GL_RGB32I]   = sizeof(glw::GLint) * 3 /* components */;
	m_internal_formats[GL_RGB32UI]  = sizeof(glw::GLuint) * 3 /* components */;
	m_internal_formats[GL_RGBA8]	= sizeof(glw::GLubyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16F]  = sizeof(glw::GLhalf) * 4 /* components */;
	m_internal_formats[GL_RGBA32F]  = sizeof(glw::GLfloat) * 4 /* components */;
	m_internal_formats[GL_RGBA8I]   = sizeof(glw::GLbyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16I]  = sizeof(glw::GLshort) * 4 /* components */;
	m_internal_formats[GL_RGBA32I]  = sizeof(glw::GLint) * 4 /* components */;
	m_internal_formats[GL_RGBA8UI]  = sizeof(glw::GLubyte) * 4 /* components */;
	m_internal_formats[GL_RGBA16UI] = sizeof(glw::GLushort) * 4 /* components */;
	m_internal_formats[GL_RGBA32UI] = sizeof(glw::GLuint) * 4 /* components */;

	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object!");

	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");
}